

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void CP_ReleaseTimestepHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  WS_ReaderInfo Reader;
  SstStream s;
  void *__ptr;
  _ReleaseRec *p_Var2;
  ulong uVar3;
  ulong uVar4;
  
  if (_perfstubs_initialized == 1) {
    if (CP_ReleaseTimestepHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                                          ,"CP_ReleaseTimestepHandler",0xa3c);
      CP_ReleaseTimestepHandler::timer = (void *)ps_timer_create_(__ptr);
      free(__ptr);
    }
    ps_timer_start_(CP_ReleaseTimestepHandler::timer);
  }
  Reader = *Msg_v;
  s = Reader->ParentStream;
  __mutex = &s->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (s->Status == Destroyed) {
    CP_verbose(s,PerRankVerbose,
               "Writer-side Rank received a timestep release event on destroyed stream %p, ignored\n"
               ,s);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  if ((long)s->ReaderCount < 1) {
    uVar4 = 0xffffffff;
  }
  else {
    uVar4 = 0xffffffff;
    uVar3 = 0;
    do {
      if (Reader == s->Readers[uVar3]) {
        uVar4 = uVar3 & 0xffffffff;
      }
      uVar3 = uVar3 + 1;
    } while ((long)s->ReaderCount != uVar3);
  }
  CP_verbose(s,TraceVerbose,
             "Received a release timestep message for timestep %ld from reader cohort %d\n",
             *(undefined8 *)((long)Msg_v + 8),uVar4);
  CP_verbose(s,TraceVerbose,"Got the lock in release timestep\n");
  Reader->LastReleasedTimestep = *(ssize_t *)((long)Msg_v + 8);
  if ((s->Rank == 0) && (s->ConfigParams->CPCommPattern == 0)) {
    p_Var2 = (_ReleaseRec *)realloc(s->ReleaseList,(long)s->ReleaseCount * 0x10 + 0x10);
    s->ReleaseList = p_Var2;
    iVar1 = s->ReleaseCount;
    p_Var2[iVar1].Timestep = *(ssize_t *)((long)Msg_v + 8);
    p_Var2[iVar1].Reader = Reader;
    s->ReleaseCount = iVar1 + 1;
  }
  CP_verbose(s,TraceVerbose,"Doing dereference sent\n");
  DerefSentTimestep(s,Reader,*(ssize_t *)((long)Msg_v + 8));
  CP_verbose(s,TraceVerbose,"Doing QueueMaint\n");
  QueueMaintenance(s);
  Reader->OldestUnreleasedTimestep = *(long *)((long)Msg_v + 8) + 1;
  pthread_cond_signal((pthread_cond_t *)&s->DataCondition);
  CP_verbose(s,TraceVerbose,"Releasing the lock in release timestep\n");
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_perfstubs_initialized != 1) {
    return;
  }
  ps_timer_stop_(CP_ReleaseTimestepHandler::timer);
  return;
}

Assistant:

extern void CP_ReleaseTimestepHandler(CManager cm, CMConnection conn, void *Msg_v,
                                      void *client_data, attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    struct _ReleaseTimestepMsg *Msg = (struct _ReleaseTimestepMsg *)Msg_v;
    WS_ReaderInfo Reader = (WS_ReaderInfo)Msg->WSR_Stream;
    SstStream ParentStream = Reader->ParentStream;
    int ReaderNum = -1;

    STREAM_MUTEX_LOCK(ParentStream);
    if (ParentStream->Status == Destroyed)
    {
        CP_verbose(ParentStream, PerRankVerbose,
                   "Writer-side Rank received a "
                   "timestep release event on destroyed stream %p, ignored\n",
                   ParentStream);
        STREAM_MUTEX_UNLOCK(ParentStream);
        return;
    }
    for (int i = 0; i < ParentStream->ReaderCount; i++)
    {
        if (Reader == ParentStream->Readers[i])
        {
            ReaderNum = i;
        }
    }
    CP_verbose(ParentStream, TraceVerbose,
               "Received a release timestep message "
               "for timestep %ld from reader cohort %d\n",
               Msg->Timestep, ReaderNum);

    /* decrement the reference count for the released timestep */
    CP_verbose(ParentStream, TraceVerbose, "Got the lock in release timestep\n");
    Reader->LastReleasedTimestep = Msg->Timestep;
    if ((ParentStream->Rank == 0) && (ParentStream->ConfigParams->CPCommPattern == SstCPCommMin))
    {
        ParentStream->ReleaseList =
            realloc(ParentStream->ReleaseList,
                    sizeof(ParentStream->ReleaseList[0]) * (ParentStream->ReleaseCount + 1));
        ParentStream->ReleaseList[ParentStream->ReleaseCount].Timestep = Msg->Timestep;
        ParentStream->ReleaseList[ParentStream->ReleaseCount].Reader = Reader;
        ParentStream->ReleaseCount++;
    }
    CP_verbose(ParentStream, TraceVerbose, "Doing dereference sent\n");
    DerefSentTimestep(ParentStream, Reader, Msg->Timestep);
    CP_verbose(ParentStream, TraceVerbose, "Doing QueueMaint\n");
    QueueMaintenance(ParentStream);
    Reader->OldestUnreleasedTimestep = Msg->Timestep + 1;
    STREAM_CONDITION_SIGNAL(ParentStream);
    CP_verbose(ParentStream, TraceVerbose, "Releasing the lock in release timestep\n");
    STREAM_MUTEX_UNLOCK(ParentStream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}